

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_clamp(ggml_compute_params *params,ggml_tensor *dst)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  size_t sVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  
  pgVar4 = dst->src[0];
  uVar16 = (ulong)pgVar4->type;
  if (0x27 < uVar16) {
    return;
  }
  if (uVar16 == 0) {
    uVar2 = dst->op_params[0];
    uVar1 = dst->op_params[1];
    lVar14 = (long)params->ith;
    lVar17 = (long)params->nth;
    iVar10 = ggml_nrows(pgVar4);
    if (dst->nb[0] == 4) {
      if (pgVar4->nb[0] == 4) {
        uVar3 = (uint)pgVar4->ne[0];
        sVar5 = pgVar4->nb[1];
        sVar6 = dst->nb[1];
        lVar15 = sVar5 * lVar14;
        lVar13 = sVar6 * lVar14;
        for (; lVar14 < iVar10; lVar14 = lVar14 + lVar17) {
          pvVar7 = dst->data;
          pvVar8 = pgVar4->data;
          for (uVar16 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar16; uVar16 = uVar16 + 1) {
            auVar18 = vminss_avx(ZEXT416(*(uint *)((long)pvVar8 + uVar16 * 4 + lVar15)),
                                 ZEXT416(uVar1));
            auVar18 = vmaxss_avx(auVar18,ZEXT416(uVar2));
            *(int *)((long)pvVar7 + uVar16 * 4 + lVar13) = auVar18._0_4_;
          }
          lVar13 = lVar13 + sVar6 * lVar17;
          lVar15 = lVar15 + sVar5 * lVar17;
        }
        return;
      }
      pcVar11 = "nb00 == sizeof(float)";
      uVar12 = 0x1318;
    }
    else {
      pcVar11 = "nb0 == sizeof(float)";
      uVar12 = 0x1317;
    }
  }
  else {
    if (uVar16 != 1) {
      if ((0x8c7fffffccU >> (uVar16 & 0x3f) & 1) == 0) {
        return;
      }
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
                 ,0x1377,"fatal error");
    }
    uVar2 = dst->op_params[0];
    uVar1 = dst->op_params[1];
    lVar17 = (long)params->ith;
    iVar10 = params->nth;
    iVar9 = ggml_nrows(pgVar4);
    if (dst->nb[0] == 2) {
      if (pgVar4->nb[0] == 2) {
        uVar3 = (uint)pgVar4->ne[0];
        lVar14 = pgVar4->nb[1] * lVar17;
        for (; lVar17 < iVar9; lVar17 = lVar17 + iVar10) {
          for (uVar16 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar16; uVar16 = uVar16 + 1) {
            auVar18 = vminss_avx(ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)
                                                          ((long)pgVar4->data + uVar16 * 2 + lVar14)
                                                  * 4)),ZEXT416(uVar1));
            auVar18 = vmaxss_avx(auVar18,ZEXT416(uVar2));
            auVar18 = vcvtps2ph_f16c(auVar18,0);
            vpextrw_avx(auVar18,0);
          }
          lVar14 = lVar14 + pgVar4->nb[1] * (long)iVar10;
        }
        return;
      }
      pcVar11 = "nb00 == sizeof(ggml_fp16_t)";
      uVar12 = 0x133c;
    }
    else {
      pcVar11 = "nb0 == sizeof(ggml_fp16_t)";
      uVar12 = 0x133b;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar12,"GGML_ASSERT(%s) failed",pcVar11);
}

Assistant:

void ggml_compute_forward_clamp(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_clamp_f32(params, dst);
            } break;
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_clamp_f16(params, dst);
            } break;
        case GGML_TYPE_BF16:
        case GGML_TYPE_Q4_0:
        case GGML_TYPE_Q4_1:
        case GGML_TYPE_Q5_0:
        case GGML_TYPE_Q5_1:
        case GGML_TYPE_Q8_0:
        case GGML_TYPE_Q8_1:
        case GGML_TYPE_Q2_K:
        case GGML_TYPE_Q3_K:
        case GGML_TYPE_Q4_K:
        case GGML_TYPE_Q5_K:
        case GGML_TYPE_Q6_K:
        case GGML_TYPE_TQ1_0:
        case GGML_TYPE_TQ2_0:
        case GGML_TYPE_IQ2_XXS:
        case GGML_TYPE_IQ2_XS:
        case GGML_TYPE_IQ3_XXS:
        case GGML_TYPE_IQ1_S:
        case GGML_TYPE_IQ1_M:
        case GGML_TYPE_IQ4_NL:
        case GGML_TYPE_IQ4_XS:
        case GGML_TYPE_IQ3_S:
        case GGML_TYPE_IQ2_S:
        case GGML_TYPE_Q8_K:
        case GGML_TYPE_I8:
        case GGML_TYPE_I16:
        case GGML_TYPE_I32:
        case GGML_TYPE_I64:
        case GGML_TYPE_F64:
        case GGML_TYPE_COUNT:
            {
                GGML_ABORT("fatal error");
            }
    }
}